

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_rect_pack.h
# Opt level: O2

int stbrp__skyline_find_min_y(stbrp_context *c,stbrp_node *first,int x0,int width,int *pwaste)

{
  int iVar1;
  int iVar2;
  undefined4 in_register_0000000c;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  
  iVar8 = c->width;
  iVar3 = (int)first;
  if (iVar3 < iVar8) {
    __assert_fail("first->x <= x0",
                  "/workspace/llm4binary/github/license_c_cmakelists/RobLoach[P]raylib-cpp/build_O2/_deps/raylib-src/src/external/stb_rect_pack.h"
                  ,0x127,
                  "int stbrp__skyline_find_min_y(stbrp_context *, stbrp_node *, int, int, int *)");
  }
  if (iVar3 < **(int **)&c->align) {
    iVar6 = 0;
    iVar5 = 0;
    iVar4 = 0;
    while (iVar8 < x0 + iVar3) {
      iVar1 = c->height;
      if (iVar1 - iVar6 == 0 || iVar1 < iVar6) {
        c = *(stbrp_context **)&c->align;
        iVar8 = c->width - iVar8;
        iVar9 = x0 - iVar5;
        if (iVar8 + iVar5 <= x0) {
          iVar9 = iVar8;
        }
        iVar7 = (iVar6 - iVar1) * iVar9;
        iVar8 = c->width;
      }
      else {
        iVar7 = (iVar1 - iVar6) * iVar5;
        c = *(stbrp_context **)&c->align;
        iVar2 = c->width;
        iVar6 = iVar1;
        if (iVar8 < iVar3) {
          iVar9 = iVar2 - iVar3;
          iVar8 = iVar2;
        }
        else {
          iVar9 = iVar2 - iVar8;
          iVar8 = iVar2;
        }
      }
      iVar4 = iVar4 + iVar7;
      iVar5 = iVar5 + iVar9;
    }
    *(int *)CONCAT44(in_register_0000000c,width) = iVar4;
    return iVar6;
  }
  __assert_fail("node->next->x > x0",
                "/workspace/llm4binary/github/license_c_cmakelists/RobLoach[P]raylib-cpp/build_O2/_deps/raylib-src/src/external/stb_rect_pack.h"
                ,0x12e,
                "int stbrp__skyline_find_min_y(stbrp_context *, stbrp_node *, int, int, int *)");
}

Assistant:

static int stbrp__skyline_find_min_y(stbrp_context *c, stbrp_node *first, int x0, int width, int *pwaste)
{
   stbrp_node *node = first;
   int x1 = x0 + width;
   int min_y, visited_width, waste_area;

   STBRP__NOTUSED(c);

   STBRP_ASSERT(first->x <= x0);

   #if 0
   // skip in case we're past the node
   while (node->next->x <= x0)
      ++node;
   #else
   STBRP_ASSERT(node->next->x > x0); // we ended up handling this in the caller for efficiency
   #endif

   STBRP_ASSERT(node->x <= x0);

   min_y = 0;
   waste_area = 0;
   visited_width = 0;
   while (node->x < x1) {
      if (node->y > min_y) {
         // raise min_y higher.
         // we've accounted for all waste up to min_y,
         // but we'll now add more waste for everything we've visted
         waste_area += visited_width * (node->y - min_y);
         min_y = node->y;
         // the first time through, visited_width might be reduced
         if (node->x < x0)
            visited_width += node->next->x - x0;
         else
            visited_width += node->next->x - node->x;
      } else {
         // add waste area
         int under_width = node->next->x - node->x;
         if (under_width + visited_width > width)
            under_width = width - visited_width;
         waste_area += under_width * (min_y - node->y);
         visited_width += under_width;
      }
      node = node->next;
   }

   *pwaste = waste_area;
   return min_y;
}